

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>,_bool>
* __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
::insert_noresize<int_const&,int&>
          (pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
          *this,int *key,int *args)

{
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>
  dVar1;
  long lVar2;
  pair<unsigned_char,_unsigned_char> pVar3;
  uint uVar4;
  
  pVar3 = dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                      *)this,key);
  uVar4 = (ushort)pVar3 & 0xff;
  if (uVar4 != 0xff) {
    lVar2 = *(long *)(this + 0x48);
    dVar1 = this[0x36];
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(lVar2 + (ulong)uVar4 * 4);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 + (ulong)(byte)dVar1 * 4);
  }
  else {
    insert_at<int&>(&__return_storage_ptr__->first,this,pVar3.second,args);
  }
  __return_storage_ptr__->second = uVar4 == 0xff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }